

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_cgreen_time.c
# Opt level: O0

uint32_t cgreen_time_get_current_milliseconds(void)

{
  int iVar1;
  timeval tv;
  timeval local_18;
  uint32_t local_4;
  
  iVar1 = gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  if (iVar1 == 0) {
    local_4 = (int)local_18.tv_sec * 1000 + (int)(local_18.tv_usec / 1000);
  }
  else {
    fprintf(_stderr,"cgreen error: could not get time of day\n");
    local_4 = 0;
  }
  return local_4;
}

Assistant:

uint32_t cgreen_time_get_current_milliseconds(void) {
#ifdef __CYGWIN__
    /* TODO: This is actually the POSIX recommended way to do this */
    struct timespec ts;
    if (clock_gettime(CLOCK_REALTIME, &ts) != 0) {
        fprintf(stderr, "cgreen error: could not get time\n");
        return 0;
    }

    return ts.tv_sec * 1000u + ts.tv_nsec / 1000000u;
#else    
    struct timeval tv;
    if (gettimeofday(&tv, NULL) != 0) {
        fprintf(stderr, "cgreen error: could not get time of day\n");
        return 0;
    }
    return tv.tv_sec * 1000u + tv.tv_usec / 1000u;
#endif
}